

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cost_enc.h
# Opt level: O0

int VP8RecordStats(int bit,proba_t *stats)

{
  proba_t p;
  proba_t *stats_local;
  int bit_local;
  
  p = *stats;
  if (0xfffdffff < p) {
    p = p + 1 >> 1 & 0x7fff7fff;
  }
  *stats = bit + 0x10000 + p;
  return bit;
}

Assistant:

static WEBP_INLINE int VP8RecordStats(int bit, proba_t* const stats) {
  proba_t p = *stats;
  // An overflow is inbound. Note we handle this at 0xfffe0000u instead of
  // 0xffff0000u to make sure p + 1u does not overflow.
  if (p >= 0xfffe0000u) {
    p = ((p + 1u) >> 1) & 0x7fff7fffu;  // -> divide the stats by 2.
  }
  // record bit count (lower 16 bits) and increment total count (upper 16 bits).
  p += 0x00010000u + bit;
  *stats = p;
  return bit;
}